

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ManDfs_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Nwk_Obj_t *pNStack_20;
  int i;
  Nwk_Obj_t *pNext;
  Vec_Ptr_t *vNodes_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetTravIdCurrent(pObj);
    local_24 = 0;
    while( true ) {
      bVar2 = false;
      if (local_24 < pObj->nFanins) {
        pNStack_20 = pObj->pFanio[local_24];
        bVar2 = pNStack_20 != (Nwk_Obj_t *)0x0;
      }
      if (!bVar2) break;
      Nwk_ManDfs_rec(pNStack_20,vNodes);
      local_24 = local_24 + 1;
    }
    Vec_PtrPush(vNodes,pObj);
  }
  return;
}

Assistant:

void Nwk_ManDfs_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManDfs_rec( pNext, vNodes );
    Vec_PtrPush( vNodes, pObj );
}